

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall
minibag::View::addQuery
          (View *this,Bag *bag,function<bool_(const_minibag::ConnectionInfo_*)> *query,
          Time *start_time,Time *end_time)

{
  BagMode BVar1;
  undefined8 uVar2;
  Time *end_time_00;
  Query *_query;
  Bag *in_RSI;
  long in_RDI;
  BagQuery *in_stack_00000028;
  View *in_stack_00000030;
  string *in_stack_ffffffffffffff28;
  BagException *in_stack_ffffffffffffff30;
  BagQuery *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  
  BVar1 = Bag::getMode(in_RSI);
  if ((BVar1 & Read) != Read) {
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    BagException::BagException(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    __cxa_throw(uVar2,&BagException::typeinfo,BagException::~BagException);
  }
  end_time_00 = (Time *)(in_RDI + 0x18);
  _query = (Query *)operator_new(0x40);
  Query::Query((Query *)in_stack_ffffffffffffff40,
               (function<bool_(const_minibag::ConnectionInfo_*)> *)in_RSI,(Time *)_query,end_time_00
              );
  BagQuery::BagQuery(in_stack_ffffffffffffff40,in_RSI,_query,(uint32_t)((ulong)end_time_00 >> 0x20))
  ;
  std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>::push_back
            ((vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_> *)_query,
             (value_type *)end_time_00);
  Query::~Query((Query *)0x17b1e3);
  std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>::back
            ((vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_> *)_query);
  updateQueries(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void View::addQuery(Bag const& bag, std::function<bool(ConnectionInfo const*)> query, miniros::Time const& start_time, miniros::Time const& end_time) {
    if ((bag.getMode() & bagmode::Read) != bagmode::Read)
        throw BagException("Bag not opened for reading");

    queries_.push_back(new BagQuery(&bag, Query(query, start_time, end_time), bag.bag_revision_));

    updateQueries(queries_.back());
}